

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

char * get_server_rep_FMformat(FMFormat_conflict format,int *rep_length)

{
  uint16_t uVar1;
  format_rep p_Var2;
  uint *in_RSI;
  long in_RDI;
  FMFormat_conflict in_stack_00000018;
  
  if (*(long *)(in_RDI + 0xa0) == 0) {
    p_Var2 = build_server_format_rep(in_stack_00000018);
    *(format_rep *)(in_RDI + 0xa0) = p_Var2;
  }
  uVar1 = ntohs(**(uint16_t **)(in_RDI + 0xa0));
  *in_RSI = (uint)uVar1;
  if (*(char *)(*(long *)(in_RDI + 0xa0) + 3) != '\0') {
    uVar1 = ntohs(*(uint16_t *)(*(long *)(in_RDI + 0xa0) + 6));
    *in_RSI = (uint)uVar1 * 0x10000 + *in_RSI;
  }
  return *(char **)(in_RDI + 0xa0);
}

Assistant:

extern char *
get_server_rep_FMformat(FMFormat format, int *rep_length)
{
    if (format->server_format_rep == NULL) {
	format->server_format_rep = 
	    build_server_format_rep(format);
    }
    *rep_length = ntohs(format->server_format_rep->format_rep_length);
    if (format->server_format_rep->server_rep_version > 0) {
	*rep_length += (ntohs(format->server_format_rep->top_bytes_format_rep_length) << 16);
    }
    return (char*)format->server_format_rep;
}